

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O0

void __thiscall Js::CompoundString::Builder<256U>::AppendSlow(Builder<256U> *this,char16 c)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  CompoundString *toString;
  JavascriptLibrary *this_00;
  CharStringCache *this_01;
  JavascriptString *s;
  bool local_31;
  bool appended;
  CompoundString *compoundString;
  char16 c_local;
  Builder<256U> *this_local;
  
  if (this->compoundString != (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x248,"(!this->compoundString)","!this->compoundString");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  toString = CreateCompoundString(this,true);
  this->compoundString = toString;
  bVar2 = HasOnlyDirectChars(this);
  if (bVar2) {
    local_31 = TryAppendGeneric<Js::CompoundString>(c,toString);
  }
  else {
    this_00 = GetLibrary(this);
    this_01 = JavascriptLibrary::GetCharStringCache(this_00);
    s = CharStringCache::GetStringForChar(this_01,c);
    local_31 = TryAppendGeneric<Js::CompoundString>(s,1,toString);
  }
  if (local_31 == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x24f,"(appended)","appended");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void CompoundString::Builder<MinimumCharCapacity>::AppendSlow(const char16 c)
    {
        Assert(!this->compoundString);
        CompoundString *const compoundString = CreateCompoundString(true);
        this->compoundString = compoundString;
        const bool appended =
            HasOnlyDirectChars()
                ? TryAppendGeneric(c, compoundString)
                : TryAppendGeneric(GetLibrary()->GetCharStringCache().GetStringForChar(c), 1, compoundString);
        Assert(appended);
    }